

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::Option::Option(Option *this,Option *param_1)

{
  LeafPattern::LeafPattern(&this->super_LeafPattern,&param_1->super_LeafPattern);
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001670e8;
  std::__cxx11::string::string((string *)&this->fShortOption,(string *)&param_1->fShortOption);
  std::__cxx11::string::string((string *)&this->fLongOption,(string *)&param_1->fLongOption);
  this->fArgcount = param_1->fArgcount;
  return;
}

Assistant:

Option(Option const&) = default;